

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O0

void dmrC_check_access(dmr_C *C,instruction *insn)

{
  uint bytes;
  basic_block *pbVar1;
  basic_block_list *pbVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  symbol *sym;
  int bit;
  int offset;
  pseudo_t pseudo;
  instruction *insn_local;
  dmr_C *C_local;
  
  pbVar1 = (insn->field_6).field_1.bb_true;
  if ((insn->bb != (basic_block *)0x0) && (*(int *)&(pbVar1->pos).field_0x4 == 2)) {
    bytes = (insn->field_6).field_5.offset;
    iVar3 = dmrC_bytes_to_bits(C->target,bytes);
    pbVar2 = pbVar1->parents;
    if ((0 < *(int *)(pbVar2->list_ + 6)) &&
       (((int)bytes < 0 || (*(int *)(pbVar2->list_ + 6) < (int)(iVar3 + (*(uint *)insn >> 8)))))) {
      pcVar4 = "past the end of";
      if ((int)bytes < 0) {
        pcVar4 = "below";
      }
      pcVar5 = dmrC_show_ident(C,(ident *)pbVar2->allocator_);
      iVar3 = dmrC_bits_to_bytes(C->target,*(int *)(pbVar2->list_ + 6));
      dmrC_warning(C,insn->pos,"invalid access %s \'%s\' (%d %d)",pcVar4,pcVar5,(ulong)bytes,iVar3);
    }
  }
  return;
}

Assistant:

void dmrC_check_access(struct dmr_C *C, struct instruction *insn)
{
	pseudo_t pseudo = insn->src;

	if (insn->bb && pseudo->type == PSEUDO_SYM) {
		int offset = insn->offset, bit = dmrC_bytes_to_bits(C->target, offset) + insn->size;
		struct symbol *sym = pseudo->sym;

		if (sym->bit_size > 0 && (offset < 0 || bit > sym->bit_size))
			dmrC_warning(C, insn->pos, "invalid access %s '%s' (%d %d)",
				offset < 0 ? "below" : "past the end of",
				dmrC_show_ident(C, sym->ident), offset,
				dmrC_bits_to_bytes(C->target, sym->bit_size));
	}
}